

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fr.h
# Opt level: O1

void __thiscall FR<8U>::FR(FR<8U> *this,int num,int _HIT)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  ulong uVar3;
  uint uVar4;
  BitSet *pBVar5;
  uchar *__s;
  Counter *__s_00;
  long lVar6;
  Counter *pCVar7;
  ulong uVar8;
  size_t __n;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  
  (this->super_Abstract<8U>).name._M_dataplus._M_p =
       (pointer)&(this->super_Abstract<8U>).name.field_2;
  (this->super_Abstract<8U>).name._M_string_length = 0;
  (this->super_Abstract<8U>).name.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<8U>).sep._M_dataplus._M_p = (pointer)&(this->super_Abstract<8U>).sep.field_2
  ;
  (this->super_Abstract<8U>).sep._M_string_length = 0;
  (this->super_Abstract<8U>).sep.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<8U>).pr = 0.0;
  (this->super_Abstract<8U>).cr = 0.0;
  (this->super_Abstract<8U>).aae = 0.0;
  (this->super_Abstract<8U>).are = 0.0;
  (this->super_Abstract<8U>)._vptr_Abstract = (_func_int **)&PTR_Init_00112ae0;
  (this->super_Abstract<8U>).HIT = _HIT;
  uVar4 = num / 0x11;
  this->SIZE = uVar4;
  this->LENGTH = uVar4 * 8;
  this->flow = 0;
  pBVar5 = (BitSet *)operator_new(0x10);
  pBVar5->LENGTH = uVar4 * 8;
  uVar8 = (ulong)((uVar4 & 0x1fffffff) + 1);
  __s = (uchar *)operator_new__(uVar8);
  pBVar5->bitset = __s;
  memset(__s,0,uVar8);
  this->bitset = pBVar5;
  __n = (long)(int)uVar4 << 4;
  uVar8 = 0xffffffffffffffff;
  if (-0x11 < num) {
    uVar8 = __n;
  }
  __s_00 = (Counter *)operator_new__(uVar8);
  if (0x20 < num + 0x10U) {
    uVar8 = (long)(int)uVar4 + 0xfffffffffffffff;
    auVar9 = vpbroadcastq_avx512vl();
    lVar6 = 0;
    auVar2 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar1 = vpmovsxbd_avx(ZEXT416(0x30201000));
    pCVar7 = __s_00;
    do {
      auVar10 = vpbroadcastq_avx512vl();
      auVar10 = vpor_avx2(auVar10,auVar2);
      uVar3 = vpcmpuq_avx512vl(auVar10,auVar9,2);
      vpscatterdq_avx512vl
                (ZEXT832(pCVar7) + ZEXT1632(auVar1),uVar3 & 0xf,
                 SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      lVar6 = lVar6 + 4;
      pCVar7 = pCVar7 + 4;
    } while (((uVar8 & 0xfffffffffffffff) - (ulong)((uint)uVar8 & 3)) + 4 != lVar6);
  }
  this->counter = __s_00;
  memset(__s_00,0,__n);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Abstract<8U>).name,0,
             (char *)(this->super_Abstract<8U>).name._M_string_length,0x10d863);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Abstract<8U>).sep,0,
             (char *)(this->super_Abstract<8U>).sep._M_string_length,0x10d866);
  return;
}

Assistant:

FR(int num, int _HIT) {
		this->HIT = _HIT;
		SIZE = num / 17;
		// SIZE = 118750 + 30000 * (num - 1);
		LENGTH = 8 * SIZE;
		// LENGTH = 800000 + 160000 * (num - 1);
		flow = 0;
		bitset = new BitSet(LENGTH);
		counter = new Counter[SIZE];
		memset(counter, 0, sizeof(Counter) * SIZE);
		this->name = "FR";
		this->sep = "\t\t\t";
	}